

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# linear_hash.c
# Opt level: O2

int key_bytes_to_int(ion_byte_t *key,linear_hash_table_t *linear_hash)

{
  int iVar1;
  int iVar2;
  ulong uVar3;
  
  iVar1 = (linear_hash->super).record.key_size;
  iVar2 = 1;
  if (1 < iVar1) {
    iVar2 = iVar1;
  }
  iVar1 = 0;
  for (uVar3 = 0; iVar2 - 1 != uVar3; uVar3 = uVar3 + 1) {
    iVar1 = iVar1 + (key_bytes_to_int::coefficients[uVar3 + 1] -
                    key_bytes_to_int::coefficients[uVar3]) * (uint)key[uVar3];
  }
  return iVar1;
}

Assistant:

int
key_bytes_to_int(
	ion_byte_t			*key,
	linear_hash_table_t *linear_hash
) {
	int			i;
	int			key_bytes_as_int	= 0;
	static int	coefficients[]		= { 3, 5, 7, 11, 13, 17, 19 };

	for (i = 0; i < linear_hash->super.record.key_size - 1; i++) {
		key_bytes_as_int += *(key + i) * coefficients[i + 1] - *(key + i) * coefficients[i];
	}

	return key_bytes_as_int;
}